

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JobManager::PrepareDtlsConfig
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aNid,Config *aConfig)

{
  string *this_00;
  char cVar1;
  pointer pcVar2;
  Status SVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  BorderRouter *br;
  char *pcVar7;
  type atVar8 [2];
  pointer pBVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ushort uVar12;
  _Alloc_hider _Var13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool aNeedPSKc;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  writer write;
  string domainName;
  SecurityMaterials dtlsConfig;
  BRArray brs;
  Network nwk;
  undefined1 local_290 [8];
  undefined1 *local_288;
  char local_280 [8];
  undefined1 local_278 [16];
  string local_268;
  int local_244;
  JobManager *local_240;
  undefined1 local_238 [8];
  _Alloc_hider _Stack_230;
  undefined1 local_228 [24];
  code *local_210;
  code *local_208;
  string local_1f8;
  Config *local_1d0;
  string local_1c8;
  SecurityMaterials local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  BorderRouterArray local_128;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  Network local_90;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_130 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_130;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1a8.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  persistent_storage::Network::Network(&local_90);
  local_128.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240 = this;
  atVar8[0]._0_1_ =
       persistent_storage::Registry::GetBorderRoutersInNetwork
                 ((this->mInterpreter->mRegistry).
                  super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,aNid,&local_128);
  if ((Status)atVar8[0] == kSuccess) {
    if (local_128.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_128.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar5 = false;
      aNeedPSKc = false;
    }
    else {
      aNeedPSKc = false;
      bVar5 = false;
      pBVar9 = local_128.
               super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        uVar12 = *(ushort *)&(pBVar9->mAgent).mState & 7;
        if ((ushort)(uVar12 - 3) < 2) {
          bVar5 = true;
        }
        if ((uVar12 | 2) == 3) {
          aNeedPSKc = true;
        }
        pBVar9 = pBVar9 + 1;
      } while (pBVar9 != local_128.
                         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    SVar3 = persistent_storage::Registry::GetNetworkByXpan
                      ((local_240->mInterpreter->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,aNid,&local_90);
    if (SVar3 == kSuccess) {
      local_244 = local_90.mCcm;
      SVar3 = persistent_storage::Registry::GetDomainNameByXpan
                        ((local_240->mInterpreter->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,aNid,&local_1c8);
      local_1d0 = aConfig;
      if (SVar3 != kSuccess) {
        local_290 = (undefined1  [8])local_280;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"job-manager","");
        local_238._0_4_ = string_type;
        local_238._4_4_ = int_type;
        pcVar10 = "{}: domain resolution failed with status={}";
        _Stack_230._M_p = "{}: domain resolution failed with status={}";
        local_228._0_8_ = 0x2b;
        local_228._8_8_ = 0x200000000;
        local_210 = ::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_208 = ::fmt::v10::detail::
                    parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
        local_228._16_8_ = local_238;
        local_1f8._M_dataplus._M_p = local_238;
        do {
          cVar1 = *pcVar10;
          pcVar7 = pcVar10;
          while (cVar1 != '{') {
            pcVar7 = pcVar7 + 1;
            if (pcVar7 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              ::writer::operator()((writer *)&local_1f8,pcVar10,"");
              goto LAB_002834b3;
            }
            cVar1 = *pcVar7;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          ::writer::operator()((writer *)&local_1f8,pcVar10,pcVar7);
          pcVar10 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,int>&>
                              (pcVar7,"",
                               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                *)local_238);
        } while (pcVar10 != "");
LAB_002834b3:
        utils::Hex<unsigned_long>(&local_1f8,aNid);
        local_228._0_8_ = ZEXT18(SVar3);
        local_238 = (undefined1  [8])local_1f8._M_dataplus._M_p;
        _Stack_230._M_p = (pointer)local_1f8._M_string_length;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)local_238;
        fmt_01.size_ = 0x1d;
        fmt_01.data_ = (char *)0x2b;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_268,(v10 *)"{}: domain resolution failed with status={}",fmt_01,args_01);
        aConfig = local_1d0;
        Log(kDebug,(string *)local_290,&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        if (local_290 != (undefined1  [8])local_280) {
          operator_delete((void *)local_290);
        }
      }
      aConfig->mEnableCcm = 0 < local_90.mCcm;
      if ((local_1c8._M_string_length != 0 & bVar5) == 1) {
        std::__cxx11::string::_M_assign((string *)&aConfig->mDomainName);
        iVar6 = std::__cxx11::string::compare((char *)&local_1c8);
        if (iVar6 == 0) {
          local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
          local_228._0_8_ = (pointer)0x0;
          local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
          __return_storage_ptr__->mCode = kNone;
          _Stack_230._M_p = local_228 + 8;
          std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_230);
          if (_Stack_230._M_p != local_228 + 8) {
            operator_delete(_Stack_230._M_p);
          }
          goto LAB_00283834;
        }
        security_material::GetDomainSM((Error *)local_238,&local_1c8,&local_1a8);
        __return_storage_ptr__->mCode = local_238._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_230);
        pcVar10 = local_228 + 8;
        if (_Stack_230._M_p != pcVar10) {
          operator_delete(_Stack_230._M_p);
        }
        if (__return_storage_ptr__->mCode != kNone) {
          local_238 = (undefined1  [8])local_228;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"job-manager","");
          ::fmt::v10::detail::
          check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          local_268._M_dataplus._M_p = (__return_storage_ptr__->mMessage)._M_dataplus._M_p;
          local_268._M_string_length = (__return_storage_ptr__->mMessage)._M_string_length;
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)&local_268;
          fmt_02.size_ = 0xd;
          fmt_02.data_ = (char *)0x2;
          ::fmt::v10::vformat_abi_cxx11_((string *)local_290,(v10 *)0x2f901d,fmt_02,args_02);
          Log(kDebug,(string *)local_238,(string *)local_290);
          if (local_290 != (undefined1  [8])local_280) {
            operator_delete((void *)local_290);
          }
          if (local_238 != (undefined1  [8])local_228) {
            operator_delete((void *)local_238);
          }
          if (__return_storage_ptr__->mCode != kNotFound) {
            pcVar2 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p;
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,pcVar2,
                       pcVar2 + (__return_storage_ptr__->mMessage)._M_string_length);
            WarningMsg(local_240,aNid,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
          }
          local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
          local_228._0_8_ = (pointer)0x0;
          local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
          __return_storage_ptr__->mCode = kNone;
          _Stack_230._M_p = pcVar10;
          std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_230);
          if (_Stack_230._M_p != pcVar10) {
            operator_delete(_Stack_230._M_p);
          }
        }
        bVar4 = security_material::SecurityMaterials::IsEmpty(&local_1a8,0 < local_244);
        if (bVar4) goto LAB_00283834;
        if (aNeedPSKc != false) {
          local_290 = (undefined1  [8])local_280;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"job-manager","");
          ::fmt::v10::detail::
          check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          utils::Hex<unsigned_long>(&local_1f8,aNid);
          local_238 = (undefined1  [8])local_1f8._M_dataplus._M_p;
          _Stack_230._M_p = (pointer)local_1f8._M_string_length;
          local_228._0_8_ = local_90.mName._M_dataplus._M_p;
          local_228._8_8_ = local_90.mName._M_string_length;
          args_03.field_1.args_ = in_R9.args_;
          args_03.desc_ = (unsigned_long_long)local_238;
          fmt_03.size_ = 0xdd;
          fmt_03.data_ = (char *)0x2e;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_268,(v10 *)"loading PSKc ignored for CCM network [{}:\'{}\']",fmt_03,
                     args_03);
          Log(kDebug,(string *)local_290,&local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
          _Var13._M_p = (pointer)local_290;
          if (local_290 == (undefined1  [8])local_280) goto LAB_00283c79;
LAB_00283c74:
          operator_delete(_Var13._M_p);
        }
      }
      else {
LAB_00283834:
        utils::Hex<unsigned_long>((string *)local_290,local_90.mXpan);
        security_material::GetNetworkSM
                  ((Error *)local_238,(string *)local_290,bVar5,aNeedPSKc,&local_1a8);
        __return_storage_ptr__->mCode = local_238._0_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_230);
        if (_Stack_230._M_p != local_228 + 8) {
          operator_delete(_Stack_230._M_p);
        }
        aConfig = local_1d0;
        if (local_290 != (undefined1  [8])local_280) {
          operator_delete((void *)local_290);
        }
        if (__return_storage_ptr__->mCode != kNone) {
          local_290 = (undefined1  [8])local_280;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"job-manager","");
          local_238._0_4_ = string_type;
          _Stack_230._M_p = "{}";
          local_228._0_8_ = 2;
          local_228._8_8_ = 0x100000000;
          local_210 = ::fmt::v10::detail::
                      parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar10 = "{}";
          local_228._16_8_ = local_238;
          do {
            pcVar7 = pcVar10 + 1;
            if (*pcVar10 == '}') {
              if ((pcVar7 == "") || (*pcVar7 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar7 = pcVar10 + 2;
            }
            else if (*pcVar10 == '{') {
              pcVar7 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar10,"",
                                  (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_238);
            }
            pcVar10 = pcVar7;
          } while (pcVar7 != "");
          local_238 = (undefined1  [8])(__return_storage_ptr__->mMessage)._M_dataplus._M_p;
          _Stack_230._M_p = (pointer)(__return_storage_ptr__->mMessage)._M_string_length;
          args_04.field_1.args_ = in_R9.args_;
          args_04.desc_ = (unsigned_long_long)local_238;
          fmt_04.size_ = 0xd;
          fmt_04.data_ = (char *)0x2;
          ::fmt::v10::vformat_abi_cxx11_(&local_268,(v10 *)0x2f901d,fmt_04,args_04);
          Log(kDebug,(string *)local_290,&local_268);
          aConfig = local_1d0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if (local_290 != (undefined1  [8])local_280) {
            operator_delete((void *)local_290);
          }
          if (__return_storage_ptr__->mCode != kNotFound) {
            pcVar2 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar2,
                       pcVar2 + (__return_storage_ptr__->mMessage)._M_string_length);
            WarningMsg(local_240,aNid,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
          }
          local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
          local_228._0_8_ = (pointer)0x0;
          local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
          __return_storage_ptr__->mCode = kNone;
          _Stack_230._M_p = local_228 + 8;
          std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_230);
          if (_Stack_230._M_p != local_228 + 8) {
            operator_delete(_Stack_230._M_p);
          }
        }
        bVar4 = security_material::SecurityMaterials::IsAnyFound(&local_1a8,bVar5,aNeedPSKc,false);
        if (!bVar4) {
          security_material::GetNetworkSM
                    ((Error *)local_238,&local_90.mName,bVar5,aNeedPSKc,&local_1a8);
          __return_storage_ptr__->mCode = local_238._0_4_;
          std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_230);
          if (_Stack_230._M_p != local_228 + 8) {
            operator_delete(_Stack_230._M_p);
          }
          if (__return_storage_ptr__->mCode != kNone) {
            local_290 = (undefined1  [8])local_280;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"job-manager","");
            local_238._0_4_ = string_type;
            _Stack_230._M_p = "{}";
            local_228._0_8_ = 2;
            local_228._8_8_ = 0x100000000;
            local_210 = ::fmt::v10::detail::
                        parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar10 = "{}";
            local_228._16_8_ = local_238;
            do {
              pcVar7 = pcVar10 + 1;
              if (*pcVar10 == '}') {
                if ((pcVar7 == "") || (*pcVar7 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar7 = pcVar10 + 2;
              }
              else if (*pcVar10 == '{') {
                pcVar7 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                   (pcVar10,"",
                                    (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_238);
              }
              pcVar10 = pcVar7;
            } while (pcVar7 != "");
            local_238 = (undefined1  [8])(__return_storage_ptr__->mMessage)._M_dataplus._M_p;
            _Stack_230._M_p = (pointer)(__return_storage_ptr__->mMessage)._M_string_length;
            args_05.field_1.args_ = in_R9.args_;
            args_05.desc_ = (unsigned_long_long)local_238;
            fmt_05.size_ = 0xd;
            fmt_05.data_ = (char *)0x2;
            ::fmt::v10::vformat_abi_cxx11_(&local_268,(v10 *)0x2f901d,fmt_05,args_05);
            Log(kDebug,(string *)local_290,&local_268);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p);
            }
            if (local_290 != (undefined1  [8])local_280) {
              operator_delete((void *)local_290);
            }
            if (__return_storage_ptr__->mCode != kNotFound) {
              pcVar2 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p;
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,pcVar2,
                         pcVar2 + (__return_storage_ptr__->mMessage)._M_string_length);
              WarningMsg(local_240,aNid,&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
            }
            local_238 = (undefined1  [8])((ulong)local_238 & 0xffffffff00000000);
            local_228._0_8_ = (pointer)0x0;
            local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
            __return_storage_ptr__->mCode = kNone;
            _Stack_230._M_p = local_228 + 8;
            std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_230);
            _Var13._M_p = _Stack_230._M_p;
            if (_Stack_230._M_p != local_228 + 8) goto LAB_00283c74;
          }
        }
      }
LAB_00283c79:
      if (local_1a8.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1a8.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mCertificate,&local_1a8.mCertificate);
      }
      if (local_1a8.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1a8.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mPrivateKey,&local_1a8.mPrivateKey);
      }
      if (local_1a8.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1a8.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mTrustAnchor,&local_1a8.mTrustAnchor);
      }
      if (local_1a8.mCommissionerToken.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1a8.mCommissionerToken.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mCommissionerToken,&local_1a8.mCommissionerToken);
      }
      if (local_1a8.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1a8.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mPSKc,&local_1a8.mPSKc);
      }
      bVar4 = security_material::SecurityMaterials::IsEmpty(&local_1a8,0 < local_244);
      if (bVar4) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   "no updates to DTLS configuration, default configuration will be used","");
        InfoMsg(local_240,aNid,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
      }
      if ((aConfig->mCertificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (aConfig->mCertificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&local_1a8.mCertificate,&aConfig->mCertificate);
      }
      if ((aConfig->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (aConfig->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&local_1a8.mPrivateKey,&aConfig->mPrivateKey);
      }
      if ((aConfig->mTrustAnchor).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (aConfig->mTrustAnchor).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&local_1a8.mTrustAnchor,&aConfig->mTrustAnchor);
      }
      if ((aConfig->mCommissionerToken).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (aConfig->mCommissionerToken).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&local_1a8.mCommissionerToken,&aConfig->mCommissionerToken);
      }
      if ((aConfig->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          (aConfig->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&local_1a8.mPSKc,&aConfig->mPSKc);
      }
      bVar5 = security_material::SecurityMaterials::IsIncomplete
                        (&local_1a8,bVar5,aNeedPSKc,0 < local_244);
      if (!bVar5) goto LAB_00283fc9;
      local_238._0_4_ = string_type;
      local_238._4_4_ = string_type;
      pcVar10 = "incomplete DTLS configuration for the network [{}:\'{}\']";
      _Stack_230._M_p = "incomplete DTLS configuration for the network [{}:\'{}\']";
      local_228._0_8_ = 0x37;
      local_228._8_8_ = 0x200000000;
      local_210 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_208 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_228._16_8_ = local_238;
      local_1f8._M_dataplus._M_p = local_238;
      do {
        cVar1 = *pcVar10;
        pcVar7 = pcVar10;
        while (cVar1 != '{') {
          pcVar7 = pcVar7 + 1;
          if (pcVar7 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&local_1f8,pcVar10,"");
            goto LAB_00283f09;
          }
          cVar1 = *pcVar7;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_1f8,pcVar10,pcVar7);
        pcVar10 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                            (pcVar7,"",
                             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_238);
      } while (pcVar10 != "");
LAB_00283f09:
      utils::Hex<unsigned_long>(&local_1f8,aNid);
      local_238 = (undefined1  [8])local_1f8._M_dataplus._M_p;
      _Stack_230._M_p = (pointer)local_1f8._M_string_length;
      local_228._0_8_ = local_90.mName._M_dataplus._M_p;
      local_228._8_8_ = local_90.mName._M_string_length;
      args_06.field_1.args_ = in_R9.args_;
      args_06.desc_ = (unsigned_long_long)local_238;
      fmt_06.size_ = 0xdd;
      fmt_06.data_ = (char *)0x37;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_268,(v10 *)"incomplete DTLS configuration for the network [{}:\'{}\']",
                 fmt_06,args_06);
      local_290._0_4_ = 6;
      local_288 = local_278;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_268._M_dataplus._M_p,
                 local_268._M_dataplus._M_p + local_268._M_string_length);
      __return_storage_ptr__->mCode = local_290._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_288);
      if (local_288 != local_278) {
        operator_delete(local_288);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      paVar11 = &local_1f8.field_2;
    }
    else {
      local_238._0_4_ = string_type;
      _Stack_230._M_p = "network not found by XPAN \'{}\'";
      local_228._0_8_ = (pointer)0x1e;
      local_228._8_8_ = 0x100000000;
      local_210 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar10 = "network not found by XPAN \'{}\'";
      local_228._16_8_ = local_238;
      do {
        pcVar7 = pcVar10 + 1;
        if (*pcVar10 == '}') {
          if ((pcVar7 == "") || (*pcVar7 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar7 = pcVar10 + 2;
        }
        else if (*pcVar10 == '{') {
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar10,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_238);
        }
        pcVar10 = pcVar7;
      } while (pcVar7 != "");
      utils::Hex<unsigned_long>((string *)local_238,aNid);
      local_1f8._M_dataplus._M_p = (pointer)local_238;
      local_1f8._M_string_length = (size_type)_Stack_230._M_p;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_1f8;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1e;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_268,(v10 *)"network not found by XPAN \'{}\'",fmt_00,args_00);
      local_290._0_4_ = 5;
      local_288 = local_278;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,local_268._M_dataplus._M_p,
                 local_268._M_dataplus._M_p + local_268._M_string_length);
      __return_storage_ptr__->mCode = local_290._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_288);
      if (local_288 != local_278) {
        operator_delete(local_288);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228;
    }
  }
  else {
    local_238._0_4_ = int_type;
    _Stack_230._M_p = "br lookup failed with status={}";
    local_228._0_8_ = (pointer)0x1f;
    local_228._8_8_ = 0x100000000;
    local_210 = ::fmt::v10::detail::
                parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    pcVar10 = "br lookup failed with status={}";
    local_228._16_8_ = local_238;
    do {
      pcVar7 = pcVar10 + 1;
      if (*pcVar10 == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = pcVar10 + 2;
      }
      else if (*pcVar10 == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                           (pcVar10,"",(format_string_checker<char> *)local_238);
      }
      pcVar10 = pcVar7;
    } while (pcVar7 != "");
    atVar8._1_7_ = 0;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_238;
    fmt.size_ = 1;
    fmt.data_ = (char *)0x1f;
    local_238 = (undefined1  [8])atVar8;
    ::fmt::v10::vformat_abi_cxx11_(&local_268,(v10 *)"br lookup failed with status={}",fmt,args);
    local_290._0_4_ = 0x12;
    local_288 = local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,local_268._M_dataplus._M_p,
               local_268._M_dataplus._M_p + local_268._M_string_length);
    __return_storage_ptr__->mCode = local_290._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_288);
    if (local_288 != local_278) {
      operator_delete(local_288);
    }
    paVar11 = &local_268.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar11->_M_allocated_capacity)[-2] != paVar11) {
    operator_delete((undefined1 *)(&paVar11->_M_allocated_capacity)[-2]);
  }
LAB_00283fc9:
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mMlp._M_dataplus._M_p != &local_90.mMlp.field_2) {
    operator_delete(local_90.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mName._M_dataplus._M_p != &local_90.mName.field_2) {
    operator_delete(local_90.mName._M_dataplus._M_p);
  }
  if (local_1a8.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.mCommissionerToken.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.mTrustAnchor.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.mCertificate.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.mPrivateKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.mPSKc.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareDtlsConfig(uint64_t aNid, Config &aConfig)
{
    Error             error;
    std::string       domainName;
    bool              isCCM = false;
    SecurityMaterials dtlsConfig;
    Network           nwk;
    BRArray           brs;
    bool              needCert = false;
    bool              needPSKc = false;
    RegistryStatus    status   = mInterpreter.mRegistry->GetBorderRoutersInNetwork(aNid, brs);

    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("br lookup failed with status={}", static_cast<int>(status)));

    // review the network BRs connection modes that may require
    // certain supported type of credentials
    for (const auto &br : brs)
    {
        if (br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kVendorSpecific ||
            br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kX509Connection)
        {
            needCert = true;
        }
        if (br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kVendorSpecific ||
            br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kPSKcConnection)
        {
            needPSKc = true;
        }
    }

    /// @note: If vendor specific connection mode encountered, PSKc as
    ///        well as X.509 cert will be prepared to be available to
    ///        choose from; in case of another security material
    ///        type(s) required by BR vendor, please update
    ///        JobManager::PrepareDtlsConfig() method appropriately.

    status = mInterpreter.mRegistry->GetNetworkByXpan(aNid, nwk);
    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_NOT_FOUND("network not found by XPAN '{}'", utils::Hex(aNid)));
    isCCM  = nwk.mCcm > 0;
    status = mInterpreter.mRegistry->GetDomainNameByXpan(aNid, domainName);
    if (status != RegistryStatus::kSuccess)
    {
        LOG_DEBUG(LOG_REGION_JOB_MANAGER, "{}: domain resolution failed with status={}", utils::Hex(aNid),
                  static_cast<int>(status));
    }

    aConfig.mEnableCcm = isCCM;
    if (!domainName.empty() && needCert)
    {
        aConfig.mDomainName = domainName;
        if (domainName != "DefaultDomain")
        {
            error = security_material::GetDomainSM(domainName, dtlsConfig);
            if (ERROR_NONE != error)
            {
                LOG_STR(DEBUG, LOG_REGION_JOB_MANAGER, error.GetMessage());
                if (ErrorCode::kNotFound != error.GetCode())
                {
                    WarningMsg(aNid, error.GetMessage());
                }
                error = ERROR_NONE;
            }
            if (!dtlsConfig.IsEmpty(isCCM))
            {
                if (needPSKc)
                {
                    /// @note: Please also note for CCM networks that only
                    ///        X.509 based credentials are valid for
                    ///        loading. Therefore, any other connection
                    ///        mode is considered a wrong configuration of
                    ///        border router, and respectively ignored.
                    LOG_DEBUG(LOG_REGION_JOB_MANAGER, "loading PSKc ignored for CCM network [{}:'{}']",
                              utils::Hex(aNid), nwk.mName);
                }
                goto update;
            }
        }
        else
        {
            // a network of DefaultDomain is a non-CCM one; we will
            // look up in a folder under nwk later
            error = ERROR_NONE;
        }
    }

    error = security_material::GetNetworkSM(utils::Hex(nwk.mXpan), needCert, needPSKc, dtlsConfig);
    if (ERROR_NONE != error)
    {
        LOG_STR(DEBUG, LOG_REGION_JOB_MANAGER, error.GetMessage());
        if (ErrorCode::kNotFound != error.GetCode())
        {
            WarningMsg(aNid, error.GetMessage());
        }
        // else we try a chance with nwk.mName later
        error = ERROR_NONE;
    }
    if (dtlsConfig.IsAnyFound(needCert, needPSKc))
    {
        goto update;
    }
    error = security_material::GetNetworkSM(nwk.mName, needCert, needPSKc, dtlsConfig);
    if (ERROR_NONE != error)
    {
        LOG_STR(DEBUG, LOG_REGION_JOB_MANAGER, error.GetMessage());
        if (ErrorCode::kNotFound != error.GetCode())
        {
            WarningMsg(aNid, error.GetMessage());
        }
        // nothing found, so continue with default values
        error = ERROR_NONE;
    }
update:

#define UPDATE_IF_SET(name)            \
    if (dtlsConfig.m##name.size() > 0) \
    aConfig.m##name = dtlsConfig.m##name

    UPDATE_IF_SET(Certificate);
    UPDATE_IF_SET(PrivateKey);
    UPDATE_IF_SET(TrustAnchor);
    UPDATE_IF_SET(CommissionerToken);
    UPDATE_IF_SET(PSKc);

#undef UPDATE_IF_SET

    if (dtlsConfig.IsEmpty(isCCM))
    {
        InfoMsg(aNid, "no updates to DTLS configuration, default configuration will be used");
    }

#define UPDATE_IF_SET(name)         \
    if (aConfig.m##name.size() > 0) \
    dtlsConfig.m##name = aConfig.m##name

    UPDATE_IF_SET(Certificate);
    UPDATE_IF_SET(PrivateKey);
    UPDATE_IF_SET(TrustAnchor);
    UPDATE_IF_SET(CommissionerToken);
    UPDATE_IF_SET(PSKc);

#undef UPDATE_IF_SET
    if (dtlsConfig.IsIncomplete(needCert, needPSKc, isCCM))
    {
        error = ERROR_SECURITY("incomplete DTLS configuration for the network [{}:'{}']", utils::Hex(aNid), nwk.mName);
    }
exit:
    return error;
}